

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

void __thiscall adios2sys::RegExpCompile::reginsert(RegExpCompile *this,char op,char *opnd)

{
  char *pcVar1;
  
  pcVar1 = this->regcode;
  if (pcVar1 != &regdummy) {
    this->regcode = pcVar1 + 3;
    for (; opnd < pcVar1; pcVar1 = pcVar1 + -1) {
      pcVar1[2] = pcVar1[-1];
    }
    *opnd = op;
    opnd[1] = '\0';
    opnd[2] = '\0';
    return;
  }
  this->regsize = this->regsize + 3;
  return;
}

Assistant:

void RegExpCompile::reginsert(char op, char* opnd)
{
  char* src;
  char* dst;
  char* place;

  if (regcode == regdummyptr) {
    regsize += 3;
    return;
  }

  src = regcode;
  regcode += 3;
  dst = regcode;
  while (src > opnd)
    *--dst = *--src;

  place = opnd; // Op node, where operand used to be.
  *place++ = op;
  *place++ = '\0';
  *place = '\0';
}